

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

void xmlDumpAttributeDecl(xmlBufferPtr buf,xmlAttributePtr attr)

{
  char *pcVar1;
  
  if (attr == (xmlAttributePtr)0x0 || buf == (xmlBufferPtr)0x0) {
    return;
  }
  xmlBufferWriteChar(buf,"<!ATTLIST ");
  xmlBufferWriteCHAR(buf,attr->elem);
  xmlBufferWriteChar(buf," ");
  if (attr->prefix != (xmlChar *)0x0) {
    xmlBufferWriteCHAR(buf,attr->prefix);
    xmlBufferWriteChar(buf,":");
  }
  xmlBufferWriteCHAR(buf,attr->name);
  switch(attr->atype) {
  case XML_ATTRIBUTE_CDATA:
    pcVar1 = " CDATA";
    break;
  case XML_ATTRIBUTE_ID:
    pcVar1 = " ID";
    break;
  case XML_ATTRIBUTE_IDREF:
    pcVar1 = " IDREF";
    break;
  case XML_ATTRIBUTE_IDREFS:
    pcVar1 = " IDREFS";
    break;
  case XML_ATTRIBUTE_ENTITY:
    pcVar1 = " ENTITY";
    break;
  case XML_ATTRIBUTE_ENTITIES:
    pcVar1 = " ENTITIES";
    break;
  case XML_ATTRIBUTE_NMTOKEN:
    pcVar1 = " NMTOKEN";
    break;
  case XML_ATTRIBUTE_NMTOKENS:
    pcVar1 = " NMTOKENS";
    break;
  case XML_ATTRIBUTE_ENUMERATION:
    pcVar1 = " (";
    goto LAB_00190576;
  case XML_ATTRIBUTE_NOTATION:
    pcVar1 = " NOTATION (";
LAB_00190576:
    xmlBufferWriteChar(buf,pcVar1);
    xmlDumpEnumeration(buf,attr->tree);
    goto LAB_00190436;
  default:
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,0x17,1,XML_ERR_ERROR,(char *)0x0,0,(char *)0x0,(char *)0x0,
                    (char *)0x0,0,0,"%s","Internal: ATTRIBUTE struct corrupted invalid type\n");
    goto LAB_00190436;
  }
  xmlBufferWriteChar(buf,pcVar1);
LAB_00190436:
  switch(attr->def) {
  case XML_ATTRIBUTE_NONE:
    goto switchD_0019044f_caseD_1;
  case XML_ATTRIBUTE_REQUIRED:
    pcVar1 = " #REQUIRED";
    break;
  case XML_ATTRIBUTE_IMPLIED:
    pcVar1 = " #IMPLIED";
    break;
  case XML_ATTRIBUTE_FIXED:
    pcVar1 = " #FIXED";
    break;
  default:
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,0x17,1,XML_ERR_ERROR,(char *)0x0,0,(char *)0x0,(char *)0x0,
                    (char *)0x0,0,0,"%s","Internal: ATTRIBUTE struct corrupted invalid def\n");
    goto switchD_0019044f_caseD_1;
  }
  xmlBufferWriteChar(buf,pcVar1);
switchD_0019044f_caseD_1:
  if (attr->defaultValue != (xmlChar *)0x0) {
    xmlBufferWriteChar(buf," ");
    xmlBufferWriteQuotedString(buf,attr->defaultValue);
  }
  xmlBufferWriteChar(buf,">\n");
  return;
}

Assistant:

void
xmlDumpAttributeDecl(xmlBufferPtr buf, xmlAttributePtr attr) {
    if ((buf == NULL) || (attr == NULL))
        return;
    xmlBufferWriteChar(buf, "<!ATTLIST ");
    xmlBufferWriteCHAR(buf, attr->elem);
    xmlBufferWriteChar(buf, " ");
    if (attr->prefix != NULL) {
	xmlBufferWriteCHAR(buf, attr->prefix);
	xmlBufferWriteChar(buf, ":");
    }
    xmlBufferWriteCHAR(buf, attr->name);
    switch (attr->atype) {
	case XML_ATTRIBUTE_CDATA:
	    xmlBufferWriteChar(buf, " CDATA");
	    break;
	case XML_ATTRIBUTE_ID:
	    xmlBufferWriteChar(buf, " ID");
	    break;
	case XML_ATTRIBUTE_IDREF:
	    xmlBufferWriteChar(buf, " IDREF");
	    break;
	case XML_ATTRIBUTE_IDREFS:
	    xmlBufferWriteChar(buf, " IDREFS");
	    break;
	case XML_ATTRIBUTE_ENTITY:
	    xmlBufferWriteChar(buf, " ENTITY");
	    break;
	case XML_ATTRIBUTE_ENTITIES:
	    xmlBufferWriteChar(buf, " ENTITIES");
	    break;
	case XML_ATTRIBUTE_NMTOKEN:
	    xmlBufferWriteChar(buf, " NMTOKEN");
	    break;
	case XML_ATTRIBUTE_NMTOKENS:
	    xmlBufferWriteChar(buf, " NMTOKENS");
	    break;
	case XML_ATTRIBUTE_ENUMERATION:
	    xmlBufferWriteChar(buf, " (");
	    xmlDumpEnumeration(buf, attr->tree);
	    break;
	case XML_ATTRIBUTE_NOTATION:
	    xmlBufferWriteChar(buf, " NOTATION (");
	    xmlDumpEnumeration(buf, attr->tree);
	    break;
	default:
	    xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
		    "Internal: ATTRIBUTE struct corrupted invalid type\n",
		    NULL);
    }
    switch (attr->def) {
	case XML_ATTRIBUTE_NONE:
	    break;
	case XML_ATTRIBUTE_REQUIRED:
	    xmlBufferWriteChar(buf, " #REQUIRED");
	    break;
	case XML_ATTRIBUTE_IMPLIED:
	    xmlBufferWriteChar(buf, " #IMPLIED");
	    break;
	case XML_ATTRIBUTE_FIXED:
	    xmlBufferWriteChar(buf, " #FIXED");
	    break;
	default:
	    xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
		    "Internal: ATTRIBUTE struct corrupted invalid def\n",
		    NULL);
    }
    if (attr->defaultValue != NULL) {
	xmlBufferWriteChar(buf, " ");
	xmlBufferWriteQuotedString(buf, attr->defaultValue);
    }
    xmlBufferWriteChar(buf, ">\n");
}